

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O3

void * DirectionalLight_create(void)

{
  undefined4 *super;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  super = (undefined4 *)embree::alignedUSMMalloc(0x60,0x10,DEVICE_READ_ONLY);
  *super = 2;
  local_18._0_8_ = 0;
  local_18._8_8_ = 0x3f800000;
  local_28._0_8_ = 0x3f8000003f800000;
  local_28._8_8_ = 0x3f8000003f800000;
  DirectionalLight_set(super,(Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,1.0);
  return super;
}

Assistant:

void* DirectionalLight_create()
{
  DirectionalLight* self = (DirectionalLight*) alignedUSMMalloc(sizeof(DirectionalLight),16);
  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(DirectionalLight_sample);
  //self->super.eval = GET_FUNCTION_POINTER(DirectionalLight_eval);
  self->super.type = LIGHT_DIRECTIONAL;

  DirectionalLight_set(self, Vec3fa(0.f, 0.f, 1.f), Vec3fa(1.f), 1.f);
  return self;
}